

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.hpp
# Opt level: O2

float __thiscall hnsw::L2Distance::operator()(L2Distance *this,float *p1,float *p2)

{
  size_t *psVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  uint uVar8;
  uint32_t size;
  undefined1 (*p2_00) [32];
  undefined1 (*p1_00) [32];
  uint uVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar15 [16];
  undefined1 auVar14 [64];
  
  psVar1 = &(this->super_Distance).num;
  *psVar1 = *psVar1 + 1;
  auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
  lVar10 = 0;
  uVar8 = (uint)(this->super_Distance).dim_;
  uVar9 = uVar8 & 0xfffffff0;
  p1_00 = (undefined1 (*) [32])(p1 + uVar9);
  while( true ) {
    auVar13 = auVar14._0_32_;
    if (uVar9 <= (uint)lVar10) break;
    auVar13 = vsubps_avx(*(undefined1 (*) [32])(p1 + lVar10),*(undefined1 (*) [32])(p2 + lVar10));
    auVar7 = vsubps_avx(*(undefined1 (*) [32])(p1 + lVar10 + 8),
                        *(undefined1 (*) [32])(p2 + lVar10 + 8));
    lVar10 = lVar10 + 0x10;
    auVar14 = ZEXT3264(CONCAT428(auVar14._28_4_ + auVar13._28_4_ + auVar7._28_4_,
                                 CONCAT424(auVar14._24_4_ + auVar13._24_4_ * auVar13._24_4_ +
                                           auVar7._24_4_ * auVar7._24_4_,
                                           CONCAT420(auVar14._20_4_ +
                                                     auVar13._20_4_ * auVar13._20_4_ +
                                                     auVar7._20_4_ * auVar7._20_4_,
                                                     CONCAT416(auVar14._16_4_ +
                                                               auVar13._16_4_ * auVar13._16_4_ +
                                                               auVar7._16_4_ * auVar7._16_4_,
                                                               CONCAT412(auVar14._12_4_ +
                                                                         auVar13._12_4_ *
                                                                         auVar13._12_4_ +
                                                                         auVar7._12_4_ *
                                                                         auVar7._12_4_,
                                                                         CONCAT48(auVar14._8_4_ +
                                                                                  auVar13._8_4_ *
                                                                                  auVar13._8_4_ +
                                                                                  auVar7._8_4_ *
                                                                                  auVar7._8_4_,
                                                                                  CONCAT44(auVar14.
                                                  _4_4_ + auVar13._4_4_ * auVar13._4_4_ +
                                                  auVar7._4_4_ * auVar7._4_4_,
                                                  auVar14._0_4_ + auVar13._0_4_ * auVar13._0_4_ +
                                                  auVar7._0_4_ * auVar7._0_4_))))))));
  }
  p2_00 = (undefined1 (*) [32])(p2 + uVar9);
  size = uVar8 & 0xf;
  if (7 < size) {
    auVar13 = *p1_00;
    size = size - 8;
    p1_00 = p1_00 + 1;
    auVar7 = vsubps_avx(auVar13,*p2_00);
    p2_00 = p2_00 + 1;
    auVar13._0_4_ = auVar14._0_4_ + auVar7._0_4_ * auVar7._0_4_;
    auVar13._4_4_ = auVar14._4_4_ + auVar7._4_4_ * auVar7._4_4_;
    auVar13._8_4_ = auVar14._8_4_ + auVar7._8_4_ * auVar7._8_4_;
    auVar13._12_4_ = auVar14._12_4_ + auVar7._12_4_ * auVar7._12_4_;
    auVar13._16_4_ = auVar14._16_4_ + auVar7._16_4_ * auVar7._16_4_;
    auVar13._20_4_ = auVar14._20_4_ + auVar7._20_4_ * auVar7._20_4_;
    auVar13._24_4_ = auVar14._24_4_ + auVar7._24_4_ * auVar7._24_4_;
    auVar13._28_4_ = auVar14._28_4_ + auVar7._28_4_;
  }
  auVar12 = auVar13._0_16_;
  auVar3 = vhaddps_avx(auVar12,auVar12);
  auVar4 = vshufpd_avx(auVar12,auVar12,1);
  auVar6 = vshufps_avx(auVar12,auVar12,0xff);
  auVar15 = auVar13._16_16_;
  auVar12 = vmovshdup_avx(auVar15);
  auVar5 = vshufpd_avx(auVar15,auVar15,1);
  auVar15 = vshufps_avx(auVar15,auVar15,0xff);
  fVar2 = auVar15._0_4_ +
          auVar5._0_4_ + auVar12._0_4_ + auVar13._16_4_ + auVar6._0_4_ + auVar4._0_4_ + auVar3._0_4_
  ;
  if (size != 0) {
    fVar11 = Sqr_(this,(float *)p1_00,(float *)p2_00,size);
    fVar2 = fVar2 + fVar11;
  }
  return fVar2;
}

Assistant:

float operator()(const float *p1, const float *p2) const {
    num += 1;
#ifndef __AVX__
    return Sqr_(p1, p2, dim_);
#else
    float result = 0;

    __m256 sum;
    __m256 tmp0, tmp1;
    unsigned residual_size = dim_ % 16;
    unsigned aligned_size = dim_ - residual_size;
    const float *residual_start1 = p1 + aligned_size;
    const float *residual_start2 = p2 + aligned_size;
    float unpack[8] __attribute__((aligned(32))) = {0, 0, 0, 0, 0, 0, 0, 0};

    sum = _mm256_loadu_ps(unpack);

    const float *ptr1 = p1;
    const float *ptr2 = p2;
    for (unsigned i = 0; i < aligned_size; i += 16, ptr1 += 16, ptr2 += 16) {
      AVX_L2SQR(ptr1, ptr2, sum, tmp0, tmp1);
      AVX_L2SQR(ptr1 + 8, ptr2 + 8, sum, tmp0, tmp1);
    }
    if (residual_size >= 8) {
      AVX_L2SQR(residual_start1, residual_start2, sum, tmp0, tmp1);
      residual_size -= 8;
      residual_start1 += 8;
      residual_start2 += 8;
    }
    _mm256_storeu_ps(unpack, sum);
    result = unpack[0] + unpack[1] + unpack[2] + unpack[3] + unpack[4] + unpack[5] + unpack[6] +
             unpack[7];

    if (residual_size > 0) {
      result += Sqr_(residual_start1, residual_start2, residual_size);
    }
    return result;
#endif
  }

 private:
  float Sqr_(const float *p1, const float *p2, uint32_t size) const {
    // Auto vectorized with -O3 flag
    float sum = 0;
    for (size_t i = 0; i < size; i++) {
      float tmp = p1[i] - p2[i];
      sum += tmp * tmp;
    }
    return sum;
  }